

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

void * mz_zip_reader_extract_to_heap
                 (mz_zip_archive *pZip,mz_uint file_index,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  mz_zip_archive *pZip_00;
  uint in_ECX;
  ulong *in_RDX;
  uint in_ESI;
  long in_RDI;
  void *pBuf;
  mz_uint8 *p;
  mz_uint64 alloc_size;
  mz_uint64 uncomp_size;
  mz_uint64 comp_size;
  mz_zip_archive *pmVar2;
  void *local_20;
  void *local_8;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) || (*(uint *)(in_RDI + 0x10) <= in_ESI))
     || (*(int *)(in_RDI + 0x14) != 1)) {
    local_8 = (void *)0x0;
  }
  else {
    local_8 = (void *)(**(long **)(in_RDI + 0x58) +
                      (ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x58) + 0x20) +
                                      (ulong)in_ESI * 4));
  }
  if (in_RDX != (ulong *)0x0) {
    *in_RDX = 0;
  }
  if (local_8 == (void *)0x0) {
    local_20 = (void *)0x0;
  }
  else {
    pZip_00 = (mz_zip_archive *)(ulong)*(uint *)((long)local_8 + 0x18);
    pmVar2 = pZip_00;
    if ((in_ECX & 0x400) != 0) {
      pmVar2 = (mz_zip_archive *)(ulong)*(uint *)((long)local_8 + 0x14);
    }
    local_20 = (void *)(**(code **)(in_RDI + 0x20))(*(undefined8 *)(in_RDI + 0x38),1,pmVar2);
    if (local_20 == (void *)0x0) {
      local_20 = (void *)0x0;
    }
    else {
      mVar1 = mz_zip_reader_extract_to_mem
                        (pZip_00,(mz_uint)((ulong)pmVar2 >> 0x20),local_8,(size_t)local_20,0);
      if (mVar1 == 0) {
        (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x38),local_20);
        local_20 = (void *)0x0;
      }
      else if (in_RDX != (ulong *)0x0) {
        *in_RDX = (ulong)pmVar2;
      }
    }
  }
  return local_20;
}

Assistant:

void* mz_zip_reader_extract_to_heap(mz_zip_archive* pZip, mz_uint file_index, size_t* pSize, mz_uint flags) {
  mz_uint64 comp_size, uncomp_size, alloc_size;
  const mz_uint8* p = mz_zip_reader_get_cdh(pZip, file_index);
  void* pBuf;

  if (pSize)
    *pSize = 0;
  if (!p)
    return NULL;

  comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
  uncomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);

  alloc_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? comp_size : uncomp_size;
#ifdef _MSC_VER
  if (((0, sizeof(size_t) == sizeof(mz_uint32))) && (alloc_size > 0x7FFFFFFF))
#else
  if (((sizeof(size_t) == sizeof(mz_uint32))) && (alloc_size > 0x7FFFFFFF))
#endif
    return NULL;
  if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)alloc_size)))
    return NULL;

  if (!mz_zip_reader_extract_to_mem(pZip, file_index, pBuf, (size_t)alloc_size, flags)) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
    return NULL;
  }

  if (pSize)
    *pSize = (size_t)alloc_size;
  return pBuf;
}